

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

void helicsDataBufferToVector(HelicsDataBuffer data,double *values,int maxlen,int *actualSize)

{
  vector<double,_std::allocator<double>_> *this;
  int *piVar1;
  double *__src;
  int *in_RCX;
  int in_EDX;
  void *in_RSI;
  int length;
  vector<double,_std::allocator<double>_> v;
  SmallBuffer *ptr;
  vector<double,_std::allocator<double>_> *in_stack_00000100;
  DataType in_stack_0000010c;
  data_view *in_stack_00000110;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  undefined4 in_stack_ffffffffffffff94;
  vector<double,_std::allocator<double>_> local_40;
  SmallBuffer *local_28;
  int *local_20;
  int local_14;
  void *local_10;
  
  if ((in_RSI == (void *)0x0) || (in_EDX < 1)) {
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
  }
  else {
    local_20 = in_RCX;
    local_10 = in_RSI;
    local_28 = getBuffer((HelicsDataBuffer)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (local_28 == (SmallBuffer *)0x0) {
      if (local_20 != (int *)0x0) {
        *local_20 = 0;
      }
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x1f4b5c);
      helics::data_view::data_view
                ((data_view *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (SmallBuffer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      this = (vector<double,_std::allocator<double>_> *)helics::SmallBuffer::data(local_28);
      helics::detail::detectType
                ((byte *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      helics::valueExtract(in_stack_00000110,in_stack_0000010c,in_stack_00000100);
      helics::data_view::~data_view((data_view *)0x1f4bab);
      std::vector<double,_std::allocator<double>_>::size(&local_40);
      piVar1 = std::min<int>((int *)&stack0xffffffffffffff8c,&local_14);
      iVar2 = *piVar1;
      __src = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x1f4bf3);
      memcpy(local_10,__src,(long)iVar2 << 3);
      if (local_20 != (int *)0x0) {
        *local_20 = iVar2;
      }
      std::vector<double,_std::allocator<double>_>::~vector(this);
    }
  }
  return;
}

Assistant:

void helicsDataBufferToVector(HelicsDataBuffer data, double values[], int maxlen, int* actualSize)
{
    if ((values == nullptr) || (maxlen <= 0)) {
        if (actualSize != nullptr) {
            *actualSize = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualSize != nullptr) {
            *actualSize = 0;
        }
        return;
    }

    std::vector<double> v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxlen);
    std::memcpy(values, v.data(), length * sizeof(double));
    if (actualSize != nullptr) {
        *actualSize = length;
    }
}